

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::hilbert_init(tetgenmesh *this,int n)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint local_64;
  int local_60;
  int i;
  int c;
  int v;
  int g;
  int k;
  int f;
  int d;
  int e;
  int travel_bit;
  int mask;
  int N;
  int gc [8];
  int n_local;
  tetgenmesh *this_local;
  
  gc[7] = n;
  iVar1 = 8;
  if (n == 2) {
    iVar1 = 4;
  }
  uVar2 = 7;
  if (n == 2) {
    uVar2 = 3;
  }
  for (local_64 = 0; (int)local_64 < iVar1; local_64 = local_64 + 1) {
    (&mask)[(int)local_64] = local_64 ^ (int)local_64 >> 1;
  }
  for (f = 0; f < iVar1; f = f + 1) {
    for (k = 0; k < gc[7]; k = k + 1) {
      for (local_64 = 0; (int)local_64 < iVar1; local_64 = local_64 + 1) {
        uVar3 = (&mask)[(int)local_64] * (1 << ((byte)k & 0x1f)) * 2;
        this->transgc[f][k][(int)local_64] = (uVar3 | (int)uVar3 / iVar1) & uVar2 ^ f;
      }
    }
  }
  this->tsb1mod3[0] = 0;
  for (local_64 = 1; (int)local_64 < iVar1; local_64 = local_64 + 1) {
    i = local_64 ^ 0xffffffff ^ (local_64 ^ 0xffffffff) - 1;
    local_60 = 0;
    while (i = i >> 1, i != 0) {
      local_60 = local_60 + 1;
    }
    this->tsb1mod3[(int)local_64] = local_60 % gc[7];
  }
  return;
}

Assistant:

void tetgenmesh::hilbert_init(int n)
{
  int gc[8], N, mask, travel_bit;
  int e, d, f, k, g;
  int v, c;
  int i;

  N = (n == 2) ? 4 : 8;
  mask = (n == 2) ? 3 : 7;

  // Generate the Gray code sequence.
  for (i = 0; i < N; i++) {
    gc[i] = i ^ (i >> 1);
  }

  for (e = 0; e < N; e++) {
    for (d = 0; d < n; d++) {
      // Calculate the end point (f).
      f = e ^ (1 << d);  // Toggle the d-th bit of 'e'.
      // travel_bit = 2**p, the bit we want to travel. 
      travel_bit = e ^ f;
      for (i = 0; i < N; i++) {
        // // Rotate gc[i] left by (p + 1) % n bits.
        k = gc[i] * (travel_bit * 2);
        g = ((k | (k / N)) & mask);
        // Calculate the permuted Gray code by xor with the start point (e).
        transgc[e][d][i] = (g ^ e);
      }
    } // d
  } // e

  // Count the consecutive '1' bits (trailing) on the right.
  tsb1mod3[0] = 0;
  for (i = 1; i < N; i++) {
    v = ~i; // Count the 0s.
    v = (v ^ (v - 1)) >> 1; // Set v's trailing 0s to 1s and zero rest
    for (c = 0; v; c++) {
      v >>= 1;
    }
    tsb1mod3[i] = c % n;
  }
}